

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O1

bool __thiscall S2Cap::Contains(S2Cap *this,S2Point *p)

{
  bool bVar1;
  S1ChordAngle local_38;
  S2LogMessage local_30;
  
  bVar1 = S2::IsUnitLength(p);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x123,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: S2::IsUnitLength(p) ",0x22);
    if (!bVar1) {
      abort();
    }
  }
  S1ChordAngle::S1ChordAngle(&local_38,&this->center_,p);
  return local_38.length2_ <= (this->radius_).length2_;
}

Assistant:

bool S2Cap::Contains(const S2Point& p) const {
  S2_DCHECK(S2::IsUnitLength(p));
  return S1ChordAngle(center_, p) <= radius_;
}